

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

void __thiscall
llvm::yaml::IO::processKey<llvm::dwarf::LineNumberExtendedOps,llvm::yaml::EmptyContext>
          (IO *this,char *Key,LineNumberExtendedOps *Val,bool Required,EmptyContext *Ctx)

{
  int iVar1;
  undefined7 in_register_00000009;
  undefined8 local_38;
  void *SaveInfo;
  bool UseDefault;
  
  iVar1 = (*this->_vptr_IO[0xf])
                    (this,Key,CONCAT71(in_register_00000009,Required) & 0xffffffff,0,
                     (long)&SaveInfo + 7,&local_38);
  if ((char)iVar1 != '\0') {
    yamlize<llvm::dwarf::LineNumberExtendedOps>(this,Val,Required,Ctx);
    (*this->_vptr_IO[0x10])(this,local_38);
  }
  return;
}

Assistant:

void processKey(const char *Key, T &Val, bool Required, Context &Ctx) {
    void *SaveInfo;
    bool UseDefault;
    if ( this->preflightKey(Key, Required, false, UseDefault, SaveInfo) ) {
      yamlize(*this, Val, Required, Ctx);
      this->postflightKey(SaveInfo);
    }
  }